

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

optional<unsigned_long> ParseByteUnits(string_view str,ByteUnit default_multiplier)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Storage<unsigned_long,_true> _Var4;
  undefined8 uVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  optional<unsigned_long> oVar7;
  string_view local_20;
  _Storage<unsigned_long,_true> local_10;
  
  sVar6 = str._M_len;
  _Var4 = (_Storage<unsigned_long,_true>)
          ((_Storage<unsigned_long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  local_20 = str;
  local_10 = _Var4;
  if (sVar6 != 0) {
    bVar1 = str._M_str[sVar6 - 1];
    _Var4._M_value._1_7_ = 0;
    _Var4._M_value._0_1_ = bVar1;
    if (bVar1 == 0x47) {
      default_multiplier = G;
LAB_00b0917c:
      str = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_20,0,sVar6 - 1);
    }
    else {
      if (bVar1 == 0x74) {
        default_multiplier = t;
        goto LAB_00b0917c;
      }
      if (bVar1 == 0x4d) {
        default_multiplier = M;
        goto LAB_00b0917c;
      }
      if (bVar1 == 0x54) {
        default_multiplier = T;
        goto LAB_00b0917c;
      }
      if (bVar1 == 0x67) {
        default_multiplier = (ByteUnit)&DAT_3b9aca00;
        goto LAB_00b0917c;
      }
      if (bVar1 == 0x6b) {
        default_multiplier = k;
        goto LAB_00b0917c;
      }
      if (bVar1 == 0x6d) {
        default_multiplier = m;
        goto LAB_00b0917c;
      }
      if (bVar1 == 0x4b) {
        default_multiplier = K;
        goto LAB_00b0917c;
      }
    }
    oVar7 = ToIntegral<unsigned_long>(str);
    if (((undefined1  [16])
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      _Var4._M_value =
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload * default_multiplier;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = default_multiplier;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload;
      uVar5 = CONCAT71(SUB167(auVar2 * auVar3,9),SUB168(auVar2 * auVar3,8) == 0);
      goto LAB_00b091b5;
    }
  }
  uVar5 = 0;
LAB_00b091b5:
  if (*(ulong *)(in_FS_OFFSET + 0x28) != local_10._M_value) {
    __stack_chk_fail();
  }
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var4._M_value;
  return (optional<unsigned_long>)
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> ParseByteUnits(std::string_view str, ByteUnit default_multiplier)
{
    if (str.empty()) {
        return std::nullopt;
    }
    auto multiplier = default_multiplier;
    char unit = str.back();
    switch (unit) {
    case 'k':
        multiplier = ByteUnit::k;
        break;
    case 'K':
        multiplier = ByteUnit::K;
        break;
    case 'm':
        multiplier = ByteUnit::m;
        break;
    case 'M':
        multiplier = ByteUnit::M;
        break;
    case 'g':
        multiplier = ByteUnit::g;
        break;
    case 'G':
        multiplier = ByteUnit::G;
        break;
    case 't':
        multiplier = ByteUnit::t;
        break;
    case 'T':
        multiplier = ByteUnit::T;
        break;
    default:
        unit = 0;
        break;
    }

    uint64_t unit_amount = static_cast<uint64_t>(multiplier);
    auto parsed_num = ToIntegral<uint64_t>(unit ? str.substr(0, str.size() - 1) : str);
    if (!parsed_num || parsed_num > std::numeric_limits<uint64_t>::max() / unit_amount) { // check overflow
        return std::nullopt;
    }
    return *parsed_num * unit_amount;
}